

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::InitGoogleTestImpl<char>(int *argc,char **argv)

{
  bool bVar1;
  UnitTestImpl *this;
  char **extraout_RDX;
  char **streamable;
  char **extraout_RDX_00;
  string local_40;
  int local_1c;
  char **ppcStack_18;
  int i;
  char **argv_local;
  int *argc_local;
  
  ppcStack_18 = argv;
  argv_local = (char **)argc;
  bVar1 = GTestIsInitialized();
  if ((!bVar1) && (0 < *(int *)argv_local)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)g_argvs_abi_cxx11_);
    streamable = extraout_RDX;
    for (local_1c = 0; local_1c != *(int *)argv_local; local_1c = local_1c + 1) {
      StreamableToString<char*>(&local_40,(internal *)(ppcStack_18 + local_1c),streamable);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)g_argvs_abi_cxx11_,(value_type *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      streamable = extraout_RDX_00;
    }
    ParseGoogleTestFlagsOnly((int *)argv_local,ppcStack_18);
    this = GetUnitTestImpl();
    UnitTestImpl::PostFlagParsingInit(this);
  }
  return;
}

Assistant:

void InitGoogleTestImpl(int* argc, CharType** argv) {
  // We don't want to run the initialization code twice.
  if (GTestIsInitialized()) return;

  if (*argc <= 0) return;

  g_argvs.clear();
  for (int i = 0; i != *argc; i++) {
    g_argvs.push_back(StreamableToString(argv[i]));
  }

  ParseGoogleTestFlagsOnly(argc, argv);
  GetUnitTestImpl()->PostFlagParsingInit();
}